

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Cmd::readlineRaw_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Cmd *this,bool mask_mode)

{
  int iVar1;
  
  iVar1 = enableRawMode(this,this->in_fd_);
  if (iVar1 < 0) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  else {
    editLine_abi_cxx11_(__return_storage_ptr__,this,mask_mode);
    disableRawMode(this,this->in_fd_);
    write_char(this,'\n');
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> readlineRaw(bool mask_mode) {

		int r = enableRawMode(in_fd_);
		if (r < 0) {
			return {};
		}

		std::optional<std::string> buf = editLine(mask_mode);
		disableRawMode(in_fd_);
		write_char('\n');
		return buf;
	}